

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void __thiscall
rw::ps2::MatPipeline::instance(MatPipeline *this,Geometry *g,InstanceData *inst,Mesh *m)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint uVar4;
  uint8 *puVar5;
  uint32 *puVar6;
  uint32 local_128;
  uint local_124;
  uint local_114;
  uint i_2;
  int num;
  uint32 atsz;
  uint i_1;
  uint32 bsize;
  uint32 nverts;
  uint32 j;
  uint32 *p;
  uint32 idx;
  uint32 msk_flush;
  uint i;
  uint8 **dp;
  uint8 *datap [10];
  undefined1 local_80 [8];
  InstMeshInfo im;
  PipeAttribute *a;
  Mesh *m_local;
  InstanceData *inst_local;
  Geometry *g_local;
  MatPipeline *this_local;
  
  getInstMeshInfo((InstMeshInfo *)local_80,this,g,m);
  inst->dataSize = (im.batchSize + im.lastBatchSize) * 0x10;
  inst->dataSize = inst->dataSize + 0x7f;
  puVar5 = (uint8 *)mustmalloc_LOC((ulong)inst->dataSize,0x3000f,
                                   "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 644"
                                  );
  inst->dataRaw = puVar5;
  inst->data = (uint8 *)((ulong)(inst->dataRaw + 0x7f) & 0xffffffffffffff80);
  for (idx = 0; idx < 10; idx = idx + 1) {
    im.attribPos._32_8_ = this->attribs[idx];
    if (((PipeAttribute *)im.attribPos._32_8_ != (PipeAttribute *)0x0) &&
       ((((PipeAttribute *)im.attribPos._32_8_)->attrib & 6) != 0)) {
      datap[(ulong)idx - 1] = inst->data + (im.attribPos[(ulong)idx - 2] << 4);
    }
  }
  uVar2 = 0x6000000;
  if (0x34fff < version) {
    uVar2 = 0x11000000;
  }
  p._4_4_ = 0;
  _nverts = (uint32 *)inst->data;
  if (local_80._4_4_ == 0) {
    *_nverts = im.batchSize - 1 | 0x60000000;
    _nverts[1] = 0;
    puVar6 = _nverts + 3;
    _nverts[2] = 0x11000000;
    _nverts = _nverts + 4;
    *puVar6 = uVar2;
  }
  for (bsize = 0; bsize < im.batchVertCount; bsize = bsize + 1) {
    if (bsize < im.batchVertCount - 1) {
      atsz = im.lastBatchVertCount;
      i_1 = im.numAttribs;
    }
    else {
      atsz = im.numBatches;
      i_1 = im.numBrokenAttribs;
    }
    for (num = 0; (uint)num < 10; num = num + 1) {
      im.attribPos._32_8_ = this->attribs[(uint)num];
      if (((PipeAttribute *)im.attribPos._32_8_ != (PipeAttribute *)0x0) &&
         ((((PipeAttribute *)im.attribPos._32_8_)->attrib & 6) != 0)) {
        uVar3 = attribSize(((PipeAttribute *)im.attribPos._32_8_)->attrib);
        *_nverts = i_1 * uVar3 + 0xf >> 4 | 0x30000000;
        _nverts[1] = im.attribPos[(ulong)(uint)num - 2];
        _nverts[2] = this->inputStride | 0x1000100;
        uVar4 = (i_1 * uVar3 + 0xf & 0xfffffff0) / uVar3;
        _nverts[3] = *(uint *)(im.attribPos._32_8_ + 8) & 0xff004000 | 0x8000 | uVar4 << 0x10 | num;
        if (this->vifOffset < uVar4 * this->inputStride) {
          fprintf(_stderr,"WARNING: PS2 instance data over vifOffset %08X, %X-> %X %X\n",
                  (ulong)_nverts[3],(ulong)uVar4,(ulong)(uVar4 * this->inputStride),
                  (ulong)this->vifOffset);
        }
        _nverts[4] = 0x10000000;
        _nverts[5] = 0;
        puVar6 = _nverts + 7;
        _nverts[6] = 0;
        _nverts = _nverts + 8;
        *puVar6 = 0;
        uVar1 = im.numAttribs;
        if (g->meshHeader->flags == 1) {
          uVar1 = im.numAttribs - 2;
        }
        local_124 = uVar1 * uVar3 + 0xf >> 4;
        im.attribPos[(ulong)(uint)num - 2] = local_124 + im.attribPos[(ulong)(uint)num - 2];
      }
    }
    if (local_80._4_4_ != 0) {
      uVar4 = 0x60000000;
      if (bsize < im.batchVertCount - 1) {
        uVar4 = 0x10000000;
      }
      *_nverts = uVar4 | atsz;
      _nverts[1] = 0;
      puVar6 = _nverts + 3;
      _nverts[2] = 0;
      _nverts = _nverts + 4;
      *puVar6 = 0;
    }
    for (local_114 = 0; puVar6 = _nverts, local_114 < 10; local_114 = local_114 + 1) {
      im.attribPos._32_8_ = this->attribs[local_114];
      if (((PipeAttribute *)im.attribPos._32_8_ != (PipeAttribute *)0x0) &&
         ((((PipeAttribute *)im.attribPos._32_8_)->attrib & 6) == 0)) {
        if (version < 0x35000) {
          uVar4 = markcnt | 0x7000000;
          markcnt = markcnt + 1;
          *_nverts = uVar4;
        }
        else {
          *_nverts = 0;
        }
        _nverts = _nverts + 1;
        *_nverts = 0x5000000;
        puVar6[2] = this->inputStride | 0x1000100;
        _nverts = puVar6 + 4;
        puVar6[3] = ((PipeAttribute *)im.attribPos._32_8_)->attrib & 0xff004000 | 0x8000 |
                    i_1 << 0x10 | local_114;
        if ((undefined1 *)im.attribPos._32_8_ == attribXYZ) {
          _nverts = instanceXYZ(_nverts,g,m,p._4_4_,i_1);
        }
        else if ((undefined1 *)im.attribPos._32_8_ == attribXYZW) {
          _nverts = instanceXYZW(_nverts,g,m,p._4_4_,i_1);
        }
        else if ((undefined1 *)im.attribPos._32_8_ == attribUV) {
          _nverts = instanceUV(_nverts,g,m,p._4_4_,i_1);
        }
        else if ((undefined1 *)im.attribPos._32_8_ == attribUV2) {
          _nverts = instanceUV2(_nverts,g,m,p._4_4_,i_1);
        }
        else if ((undefined1 *)im.attribPos._32_8_ == attribRGBA) {
          _nverts = instanceRGBA(_nverts,g,m,p._4_4_,i_1);
        }
        else if ((undefined1 *)im.attribPos._32_8_ == attribNormal) {
          _nverts = instanceNormal(_nverts,g,m,p._4_4_,i_1);
        }
      }
    }
    if (g->meshHeader->flags == 1) {
      local_128 = im.numAttribs - 2;
    }
    else {
      local_128 = im.numAttribs;
    }
    p._4_4_ = local_128 + p._4_4_;
    *_nverts = i_1 | 0x4000000;
    uVar3 = 0x17000000;
    if (bsize == 0) {
      uVar3 = 0x15000000;
    }
    _nverts[1] = uVar3;
    if (bsize < im.batchVertCount - 1) {
      _nverts[2] = 0;
      _nverts[3] = 0;
    }
    else {
      _nverts[2] = 0x11000000;
      _nverts[3] = uVar2;
    }
    _nverts = _nverts + 4;
  }
  if (this->instanceCB != (_func_void_MatPipeline_ptr_Geometry_ptr_Mesh_ptr_uint8_ptr_ptr *)0x0) {
    (*this->instanceCB)(this,g,m,(uint8 **)&dp);
  }
  return;
}

Assistant:

void
MatPipeline::instance(Geometry *g, InstanceData *inst, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im = getInstMeshInfo(this, g, m);

	inst->dataSize = (im.size+im.size2)<<4;
	// TODO: do this properly, just a test right now
	inst->dataSize += 0x7F;
	inst->dataRaw = rwNewT(uint8, inst->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	inst->data = ALIGNPTR(inst->dataRaw, 0x80);

	/* make array of addresses of broken out sections */
	uint8 *datap[nelem(this->attribs)];
	uint8 **dp = datap;
	for(uint i = 0; i < nelem(this->attribs); i++)
		if((a = this->attribs[i]) && a->attrib & AT_RW)
			dp[i] = inst->data + im.attribPos[i]*0x10;

	// TODO: not sure if this is correct
	uint32 msk_flush = rw::version >= 0x35000 ? VIF_FLUSH : VIF_MSKPATH3;

	uint32 idx = 0;
	uint32 *p = (uint32*)inst->data;
	if(im.numBrokenAttribs == 0){
		*p++ = DMAret | im.size-1;
		*p++ = 0;
		*p++ = VIF_FLUSH;
		*p++ = msk_flush;
	}
	for(uint32 j = 0; j < im.numBatches; j++){
		uint32 nverts, bsize;
		if(j < im.numBatches-1){
			bsize = im.batchSize;
			nverts = im.batchVertCount;
		}else{
			bsize = im.lastBatchSize;
			nverts = im.lastBatchVertCount;
		}
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && a->attrib & AT_RW){
				uint32 atsz = attribSize(a->attrib);
				*p++ = DMAref | QWC(nverts*atsz);
				*p++ = im.attribPos[i];
				*p++ = VIF_STCYCL1 | this->inputStride;
				// Round up nverts so UNPACK will fit exactly into the DMA packet
				//  (can't pad with zeroes in broken out sections).
				int num = (QWC(nverts*atsz)<<4)/atsz;
				*p++ = (a->attrib&0xFF004000)
					| 0x8000 | num << 16 | i; // UNPACK
				// This probably shouldn't happen.
				if(num*this->inputStride > this->vifOffset)
					fprintf(stderr, "WARNING: PS2 instance data over vifOffset %08X, %X-> %X %X\n",
						p[-1], num,
						num*this->inputStride, this->vifOffset);

				*p++ = DMAcnt;
				*p++ = 0x0;
				*p++ = VIF_NOP;
				*p++ = VIF_NOP;

				im.attribPos[i] += g->meshHeader->flags == 1 ?
					QWC((im.batchVertCount-2)*atsz) :
					QWC(im.batchVertCount*atsz);
			}
		if(im.numBrokenAttribs){
			*p++ = (j < im.numBatches-1 ? DMAcnt : DMAret) | bsize;
			*p++ = 0x0;
			*p++ = VIF_NOP;
			*p++ = VIF_NOP;
		}

		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && (a->attrib & AT_RW) == 0){
				if(rw::version >= 0x35000)
					*p++ = VIF_NOP;
				else
					*p++ = VIF_MARK | markcnt++;
				*p++ = VIF_STMOD;
				*p++ = VIF_STCYCL1 | this->inputStride;
				*p++ = (a->attrib&0xFF004000)
					| 0x8000 | nverts << 16 | i; // UNPACK

				if(a == &attribXYZ)
					p = instanceXYZ(p, g, m, idx, nverts);
				else if(a == &attribXYZW)
					p = instanceXYZW(p, g, m, idx, nverts);
				else if(a == &attribUV)
					p = instanceUV(p, g, m, idx, nverts);
				else if(a == &attribUV2)
					p = instanceUV2(p, g, m, idx, nverts);
				else if(a == &attribRGBA)
					p = instanceRGBA(p, g, m, idx, nverts);
				else if(a == &attribNormal)
					p = instanceNormal(p, g, m, idx, nverts);
			}
		idx += g->meshHeader->flags == 1
			? im.batchVertCount-2 : im.batchVertCount;

		*p++ = VIF_ITOP | nverts;
		*p++ = j == 0 ? VIF_MSCALF : VIF_MSCNT;
		if(j < im.numBatches-1){
			*p++ = VIF_NOP;
			*p++ = VIF_NOP;
		}else{
			*p++ = VIF_FLUSH;
			*p++ = msk_flush;
		}
	}

	if(this->instanceCB)
		this->instanceCB(this, g, m, datap);
#ifdef RW_PS2
	if(im.numBrokenAttribs)
		fixDmaOffsets(inst);
#endif
}